

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

pair<bool,_unsigned_long> __thiscall
IntegerTokenizerRule::tryMatch(IntegerTokenizerRule *this,shared_ptr<Readable> *reader)

{
  element_type *peVar1;
  int iVar2;
  undefined8 unaff_RBX;
  ulong uVar3;
  unsigned_long uVar4;
  pair<bool,_unsigned_long> pVar5;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0);
  uVar3 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((char)iVar2 == '0') {
    uVar4 = 1;
  }
  else {
    peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0);
    if (((char)iVar2 < '1') ||
       (peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,0), '9' < (char)iVar2)) {
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4);
      } while ((byte)((char)iVar2 - 0x30U) < 10);
    }
  }
  pVar5._0_8_ = uVar3 & 0xffffffff;
  pVar5.second = uVar4;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) == '0') {
      return std::make_pair(true, 1);
    }

    if ('1' <= reader->charAt(i) && reader->charAt(i) <= '9') {
      i++;
      while (isNumeric(reader->charAt(i))) {
        i++;
      }

      return std::make_pair(true, i);
    }

    return std::make_pair(false, 0);
  }